

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic_test.cpp
# Opt level: O2

void __thiscall
Dinic_BenchmarkChainV1000E10000_Test::TestBody(Dinic_BenchmarkChainV1000E10000_Test *this)

{
  int iVar1;
  char *message;
  int iVar2;
  int a;
  bool bVar3;
  undefined1 local_c8 [8];
  Dinic d;
  ll flow;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  srand(1);
  Dinic::Dinic((Dinic *)local_c8,1000);
  iVar1 = 0;
  while (a = iVar1, a != 999) {
    iVar2 = 10;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, iVar1 = a + 1, bVar3) {
      iVar1 = rand();
      Dinic::addEdge((Dinic *)local_c8,a,a + 1,(ulong)(iVar1 % 1000 + 1000));
    }
  }
  d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)Dinic::getFlow((Dinic *)local_c8,0,999);
  local_38.ptr_._0_4_ = 0x3057;
  testing::internal::CmpHelperEQ<int,long_long>
            ((internal *)&flow,"12375","flow",(int *)&local_38,
             (longlong *)
             &d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  if ((char)flow == '\0') {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/graph/dinic_test.cpp"
               ,0x87,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_38);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  Dinic::~Dinic((Dinic *)local_c8);
  return;
}

Assistant:

TEST(Dinic, BenchmarkChainV1000E10000) {
    srand(1);
    int n = 1000;
    int m = 10000;
    int range = 1000;
    int perEdge = m / n; // yes, it's not exact
    Dinic d(n);
    rep(i, 0, n - 1) {
        rep(j, 0, perEdge) {
            d.addEdge(i, i + 1, range + rand() % range);
        }
    }
    ll flow = d.getFlow(0, n - 1);
    EXPECT_EQ(12375, flow);
}